

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_resolver.cpp
# Opt level: O2

int __thiscall
zmq::ip_resolver_t::resolve_getaddrinfo(ip_resolver_t *this,ip_addr_t *ip_addr_,char *addr_)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  addrinfo *paVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  addrinfo *res;
  uint local_50;
  int local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  res = (addrinfo *)0x0;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  uStack_40 = 0;
  bVar1 = (this->_options)._ipv6_wanted;
  local_4c = (uint)bVar1 * 8 + 2;
  local_48 = 1;
  bVar2 = (this->_options)._bindable_wanted;
  bVar3 = (this->_options)._dns_allowed;
  local_50 = (uint)bVar2;
  if ((byte)(bVar3 ^ 1U | bVar1) == 1) {
    uVar6 = bVar2 + 4;
    if (bVar3 != false) {
      uVar6 = (uint)bVar2;
    }
    local_50 = uVar6 + 8;
    if (bVar1 == false) {
      local_50 = uVar6;
    }
  }
  iVar5 = (*this->_vptr_ip_resolver_t[2])(this,addr_,0,&local_50,&res);
  if (iVar5 == -1) {
    if ((local_50 & 8) == 0) goto LAB_001704b9;
    local_50 = local_50 & 0xfffffff7;
    iVar5 = (*this->_vptr_ip_resolver_t[2])(this,addr_,0,&local_50,&res);
  }
  if (iVar5 == 0) {
    if (res == (addrinfo *)0x0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","res != NULL",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ip_resolver.cpp"
              ,0x18a);
      fflush(_stderr);
      zmq_abort("res != NULL");
    }
    uVar6 = res->ai_addrlen;
    if (0x1c < uVar6) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
              "static_cast<size_t> (res->ai_addrlen) <= sizeof (*ip_addr_)",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ip_resolver.cpp"
              ,0x18b);
      fflush(_stderr);
      zmq_abort("static_cast<size_t> (res->ai_addrlen) <= sizeof (*ip_addr_)");
      uVar6 = res->ai_addrlen;
    }
    paVar4 = res;
    memcpy(ip_addr_,res->ai_addr,(ulong)uVar6);
    (*this->_vptr_ip_resolver_t[3])(this,paVar4);
    return 0;
  }
  if (iVar5 == -10) {
    piVar7 = __errno_location();
    *piVar7 = 0xc;
    return -1;
  }
LAB_001704b9:
  bVar1 = (this->_options)._bindable_wanted;
  piVar7 = __errno_location();
  if (bVar1 == true) {
    *piVar7 = 0x13;
  }
  else {
    *piVar7 = 0x16;
  }
  return -1;
}

Assistant:

int zmq::ip_resolver_t::resolve_getaddrinfo (ip_addr_t *ip_addr_,
                                             const char *addr_)
{
#if defined ZMQ_HAVE_OPENVMS && defined __ia64
    __addrinfo64 *res = NULL;
    __addrinfo64 req;
#else
    addrinfo *res = NULL;
    addrinfo req;
#endif

    memset (&req, 0, sizeof (req));

    //  Choose IPv4 or IPv6 protocol family. Note that IPv6 allows for
    //  IPv4-in-IPv6 addresses.
    req.ai_family = _options.ipv6 () ? AF_INET6 : AF_INET;

    //  Arbitrary, not used in the output, but avoids duplicate results.
    req.ai_socktype = SOCK_STREAM;

    req.ai_flags = 0;

    if (_options.bindable ()) {
        req.ai_flags |= AI_PASSIVE;
    }

    if (!_options.allow_dns ()) {
        req.ai_flags |= AI_NUMERICHOST;
    }

#if defined AI_V4MAPPED
    //  In this API we only require IPv4-mapped addresses when
    //  no native IPv6 interfaces are available (~AI_ALL).
    //  This saves an additional DNS roundtrip for IPv4 addresses.
    if (req.ai_family == AF_INET6) {
        req.ai_flags |= AI_V4MAPPED;
    }
#endif

    //  Resolve the literal address. Some of the error info is lost in case
    //  of error, however, there's no way to report EAI errors via errno.
    int rc = do_getaddrinfo (addr_, NULL, &req, &res);

#if defined AI_V4MAPPED
    // Some OS do have AI_V4MAPPED defined but it is not supported in getaddrinfo()
    // returning EAI_BADFLAGS. Detect this and retry
    if (rc == EAI_BADFLAGS && (req.ai_flags & AI_V4MAPPED)) {
        req.ai_flags &= ~AI_V4MAPPED;
        rc = do_getaddrinfo (addr_, NULL, &req, &res);
    }
#endif

#if defined ZMQ_HAVE_WINDOWS
    //  Resolve specific case on Windows platform when using IPv4 address
    //  with ZMQ_IPv6 socket option.
    if ((req.ai_family == AF_INET6) && (rc == WSAHOST_NOT_FOUND)) {
        req.ai_family = AF_INET;
        rc = do_getaddrinfo (addr_, NULL, &req, &res);
    }
#endif

    if (rc) {
        switch (rc) {
            case EAI_MEMORY:
                errno = ENOMEM;
                break;
            default:
                if (_options.bindable ()) {
                    errno = ENODEV;
                } else {
                    errno = EINVAL;
                }
                break;
        }
        return -1;
    }

    //  Use the first result.
    zmq_assert (res != NULL);
    zmq_assert (static_cast<size_t> (res->ai_addrlen) <= sizeof (*ip_addr_));
    memcpy (ip_addr_, res->ai_addr, res->ai_addrlen);

    //  Cleanup getaddrinfo after copying the possibly referenced result.
    do_freeaddrinfo (res);

    return 0;
}